

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

nng_err nni_http_server_init(nni_http_server **serverp,nng_url *url)

{
  nni_mtx *mtx;
  int iVar1;
  nng_err nVar2;
  nni_http_server *pnVar3;
  char *pcVar4;
  nng_url local_f8;
  
  nni_mtx_lock(&http_servers_lk);
  pnVar3 = (nni_http_server *)nni_list_first(&http_servers);
  while( true ) {
    if (pnVar3 == (nni_http_server *)0x0) {
      pcVar4 = nni_http_stream_scheme(url->u_scheme);
      if (pcVar4 == (char *)0x0) {
        nVar2 = NNG_EADDRINVAL;
      }
      else {
        memcpy(&local_f8,url,200);
        local_f8.u_scheme = pcVar4;
        pnVar3 = (nni_http_server *)nni_zalloc(0x328);
        nVar2 = NNG_ENOMEM;
        if (pnVar3 != (nni_http_server *)0x0) {
          nni_mtx_init(&pnVar3->mtx);
          nni_mtx_init(&pnVar3->errors_mtx);
          nni_list_init_offset(&pnVar3->handlers,0);
          nni_list_init_offset(&pnVar3->conns,0);
          nni_mtx_init(&pnVar3->errors_mtx);
          nni_list_init_offset(&pnVar3->errors,0);
          nni_aio_init(&pnVar3->accaio,http_server_acccb,pnVar3);
          pnVar3->port = url->u_port;
          pcVar4 = nni_strdup(url->u_hostname);
          pnVar3->hostname = pcVar4;
          if ((pcVar4 == (char *)0x0) ||
             (nVar2 = nng_stream_listener_alloc_url(&pnVar3->listener,&local_f8), nVar2 != NNG_OK))
          {
            http_server_fini(pnVar3);
          }
          else {
            pnVar3->refcnt = 1;
            nni_list_append(&http_servers,pnVar3);
            *serverp = pnVar3;
            nVar2 = NNG_OK;
          }
        }
      }
      nni_mtx_unlock(&http_servers_lk);
      return nVar2;
    }
    mtx = &pnVar3->mtx;
    nni_mtx_lock(mtx);
    if (((pnVar3->closed == false) && (url->u_port == pnVar3->port)) &&
       (iVar1 = strcmp(url->u_hostname,pnVar3->hostname), iVar1 == 0)) break;
    nni_mtx_unlock(mtx);
    pnVar3 = (nni_http_server *)nni_list_next(&http_servers,pnVar3);
  }
  *serverp = pnVar3;
  pnVar3->refcnt = pnVar3->refcnt + 1;
  nni_mtx_unlock(mtx);
  nni_mtx_unlock(&http_servers_lk);
  return NNG_OK;
}

Assistant:

static nng_err
http_server_init(nni_http_server **serverp, const nng_url *url)
{
	nni_http_server *s;
	nng_err          rv;
	nng_url          my_url;
	const char      *scheme;

	if ((scheme = nni_http_stream_scheme(url->u_scheme)) == NULL) {
		return (NNG_EADDRINVAL);
	}
	// Rewrite URLs to either TLS or TCP.
	memcpy(&my_url, url, sizeof(my_url));
	my_url.u_scheme = (char *) scheme;

	if ((s = NNI_ALLOC_STRUCT(s)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_mtx_init(&s->mtx);
	nni_mtx_init(&s->errors_mtx);
	NNI_LIST_INIT(&s->handlers, nni_http_handler, node);
	NNI_LIST_INIT(&s->conns, http_sconn, node);

	nni_mtx_init(&s->errors_mtx);
	NNI_LIST_INIT(&s->errors, http_error, node);

	nni_aio_init(&s->accaio, http_server_acccb, s);

	s->port = url->u_port;

	if ((s->hostname = nni_strdup(url->u_hostname)) == NULL) {
		http_server_fini(s);
		return (NNG_ENOMEM);
	}

	if ((rv = nng_stream_listener_alloc_url(&s->listener, &my_url)) != 0) {
		http_server_fini(s);
		return (rv);
	}

	s->refcnt = 1;
	*serverp  = s;
	return (NNG_OK);
}